

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fieldpos.h
# Opt level: O1

bool __thiscall
icu_63::number::impl::NumberStringBuilder::nextFieldPosition
          (NumberStringBuilder *this,FieldPosition *fp,UErrorCode *status)

{
  int iVar1;
  bool bVar2;
  UNumberFormatFields UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  UNumberFormatFields UVar11;
  int iVar12;
  ValueOrHeapArray<UNumberFormatFields> *pVVar13;
  
  UVar3 = fp->fField;
  if (UVar3 != ~UNUM_INTEGER_FIELD) {
    if (UVar3 < UNUM_FIELD_COUNT) {
      iVar12 = fp->fEndIndex;
      if (this->fLength < iVar12) {
        iVar9 = -1;
        bVar7 = false;
      }
      else {
        iVar4 = this->fZero;
        iVar8 = this->fLength + iVar4;
        iVar9 = iVar4 + iVar12;
        bVar2 = this->fUsingHeap;
        lVar10 = (long)iVar9;
        iVar5 = iVar8;
        if (iVar8 < iVar9) {
          iVar5 = iVar9;
        }
        iVar9 = -1;
        bVar7 = false;
        do {
          UVar11 = UNUM_FIELD_COUNT;
          if (lVar10 < iVar8) {
            pVVar13 = &this->fFields;
            if ((bVar2 & 1U) != 0) {
              pVVar13 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
            }
            UVar11 = pVVar13->value[lVar10];
          }
          if (((bool)(bVar7 ^ 1U)) || (UVar3 == UVar11)) {
            if ((bool)((bVar7 ^ 1U) & UVar3 == UVar11)) {
              fp->fBeginIndex = iVar12;
              bVar7 = true;
            }
            if ((UVar11 & ~UNUM_DECIMAL_SEPARATOR_FIELD) == UNUM_INTEGER_FIELD) {
              iVar9 = ((iVar4 + iVar12) - this->fZero) + 1;
            }
            bVar6 = false;
          }
          else if ((UVar3 != UNUM_INTEGER_FIELD) ||
                  (bVar6 = false, UVar11 != UNUM_GROUPING_SEPARATOR_FIELD)) {
            fp->fEndIndex = iVar12;
            bVar6 = true;
          }
          if (bVar6) break;
          lVar10 = lVar10 + 1;
          iVar1 = (iVar4 - iVar5) + iVar12;
          iVar12 = iVar12 + 1;
        } while (iVar1 != 0);
      }
      if (UVar3 != UNUM_FRACTION_FIELD) {
        return bVar7;
      }
      if (bVar7 != false) {
        return bVar7;
      }
      if (iVar9 == -1) {
        return false;
      }
      fp->fBeginIndex = iVar9;
      fp->fEndIndex = iVar9;
      return false;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return false;
}

Assistant:

int32_t getField(void) const { return fField; }